

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusion<float>::add
          (HighDynamicRangeFusion<float> *this,Image<float,_gimage::PixelTraits<float>_> *image,
          float max_value,int id,uint64_t timestamp,bool replace_id)

{
  int iVar1;
  size_type sVar2;
  element_type *peVar3;
  reference pvVar4;
  Image<float,_gimage::PixelTraits<float>_> *pIVar5;
  ImageFloat *pIVar6;
  invalid_argument *this_00;
  int in_EDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  ImageFloat *in_RDI;
  byte in_R8B;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> p;
  size_t i;
  int k;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *in_stack_ffffffffffffff38;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  store_t_conflict v;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  ImageFloat *in_stack_ffffffffffffff88;
  float fVar7;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ImageFloat *in_stack_ffffffffffffff98;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffffa0;
  HighDynamicRangeFusion<float> *in_stack_ffffffffffffffb0;
  size_type local_40;
  undefined4 in_stack_ffffffffffffffcc;
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  sVar2 = std::
          vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
          ::size((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                  *)&in_RDI->n);
  if (sVar2 != 0) {
    std::
    vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
    ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                  *)&in_RDI->n,0);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16b7c5);
    pvVar4 = std::
             vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ::operator[](&peVar3->laplace,0);
    in_stack_ffffffffffffffa0 =
         (Image<float,_gimage::PixelTraits<float>_> *)
         Image<float,_gimage::PixelTraits<float>_>::getWidth(pvVar4);
    pIVar5 = (Image<float,_gimage::PixelTraits<float>_> *)
             Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
    if (in_stack_ffffffffffffffa0 == pIVar5) {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)&in_RDI->n,0);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16b81a);
      pvVar4 = std::
               vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ::operator[](&peVar3->laplace,0);
      in_stack_ffffffffffffff98 =
           (ImageFloat *)Image<float,_gimage::PixelTraits<float>_>::getHeight(pvVar4);
      pIVar6 = (ImageFloat *)Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
      if (in_stack_ffffffffffffff98 == pIVar6) {
        std::
        vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
        ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                      *)&in_RDI->n,0);
        peVar3 = std::
                 __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16b86b);
        pvVar4 = std::
                 vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 ::operator[](&peVar3->laplace,0);
        in_stack_ffffffffffffff94 = Image<float,_gimage::PixelTraits<float>_>::getDepth(pvVar4);
        iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI);
        if (in_stack_ffffffffffffff94 == iVar1) goto LAB_0016b8fc;
      }
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"HighDynamicRangeFusion::add(): All images must have same size and depth");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
LAB_0016b8fc:
  iVar1 = -1;
  if (-1 < in_EDX) {
    local_40 = 0;
    while( true ) {
      in_stack_ffffffffffffff78 = local_40;
      sVar2 = std::
              vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
              ::size((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                      *)&in_RDI->n);
      in_stack_ffffffffffffff87 = in_stack_ffffffffffffff78 < sVar2 && iVar1 < 0;
      if (in_stack_ffffffffffffff78 >= sVar2 || iVar1 >= 0) break;
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)&in_RDI->n,local_40);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16b986);
      if (peVar3->id == in_EDX) {
        iVar1 = (int)local_40;
      }
      local_40 = local_40 + 1;
    }
  }
  fVar7 = (float)(in_stack_ffffffffffffff78 >> 0x20);
  if ((iVar1 < 0) || ((in_R8B & 1) != 0)) {
    std::make_shared<gimage::HighDynamicRangeFusionBase::Data,int&,unsigned_long&>
              (in_stack_ffffffffffffff68,(unsigned_long *)in_stack_ffffffffffffff60);
    if (iVar1 < 0) {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::push_back((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                   *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      v = (store_t_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    }
    else {
      std::
      vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
      ::operator[]((vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                    *)&in_RDI->n,(long)iVar1);
      v = (store_t_conflict)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>::operator=
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    std::
    __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16ba63);
    createLaplacianPyramid<float>
              (in_stack_ffffffffffffffd0,
               (Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_ffffffffffffffcc,iVar1));
    std::
    __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16ba88);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16ba9b);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::size(&peVar3->laplace);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::resize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    peVar3 = std::
             __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16bac0);
    std::
    vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ::operator[](&peVar3->weight,0);
    Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
    Image<float,_gimage::PixelTraits<float>_>::getHeight(in_RSI);
    Image<float,_gimage::PixelTraits<float>_>::setSize
              (in_stack_ffffffffffffffa0,(long)in_stack_ffffffffffffff98,
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (long)in_stack_ffffffffffffff88);
    if (((ulong)in_RDI->img & 0x100) == 0) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16bb85);
      fVar7 = (float)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      Image<float,_gimage::PixelTraits<float>_>::operator=(in_stack_ffffffffffffff50,v);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16bb27);
      sVar2 = 0;
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16bb4b);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->laplace,sVar2);
      HighDynamicRangeFusionBase::setContrastWeight
                ((HighDynamicRangeFusionBase *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,
                 (ImageFloat *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),fVar7);
      fVar7 = (float)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    }
    if (((ulong)in_RDI->img & 0x10000) != 0) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16bbba);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      mulWellExposednessWeight
                (in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0,
                 (float)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    }
    if ((((ulong)in_RDI->img & 1) != 0) &&
       (iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(in_RSI), 1 < iVar1)) {
      peVar3 = std::
               __shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x16bc13);
      std::
      vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
      ::operator[](&peVar3->weight,0);
      mulSaturationWeight((HighDynamicRangeFusion<float> *)in_stack_ffffffffffffffa0,
                          in_stack_ffffffffffffff98,
                          (Image<float,_gimage::PixelTraits<float>_> *)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),fVar7);
    }
    std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>::~shared_ptr
              ((shared_ptr<gimage::HighDynamicRangeFusionBase::Data> *)0x16bc4f);
  }
  return;
}

Assistant:

void add(const Image<T> &image, float max_value=255, int id=-1, uint64_t timestamp=0,
      bool replace_id=true)
    {
      // check that image has same size and depth as previous images

      if (list.size() > 0 && (list[0]->laplace[0].getWidth() != image.getWidth() ||
          list[0]->laplace[0].getHeight() != image.getHeight() ||
          list[0]->laplace[0].getDepth() != image.getDepth()))
      {
        throw std::invalid_argument("HighDynamicRangeFusion::add(): All images must have same size and depth");
      }

      // find existing data set with the same id

      int k=-1;
      if (id >= 0)
      {
        for (size_t i=0; i<list.size() && k < 0; i++)
        {
          if (list[i]->id == id)
          {
            k=static_cast<int>(i);
          }
        }
      }

      if (k >= 0 && !replace_id)
      {
        return;
      }

      // add, replace or skip data set, depending on the id and replace_id

      std::shared_ptr<Data> p=std::make_shared<Data>(id, timestamp);

      if (k >= 0)
      {
        list[k]=p;
      }
      else
      {
        list.push_back(p);
      }

      // create Laplace pyramid from image

      createLaplacianPyramid(p->laplace, image);

      // compute weights for highest resolution

      p->weight.resize(p->laplace.size());
      p->weight[0].setSize(image.getWidth(), image.getHeight(), 1);

      // weight according to local contrast

      if (contrast)
      {
        setContrastWeight(p->weight[0], p->laplace[0], max_value);
      }
      else
      {
        p->weight[0]=1;
      }

      // weight according to exposedness, i.e. not under- or overexposed

      if (well_exposedness)
      {
        mulWellExposednessWeight(p->weight[0], image, max_value);
      }

      // if color image, weight according to saturation

      if (saturation && image.getDepth() > 1)
      {
        mulSaturationWeight(p->weight[0], image, max_value);
      }
    }